

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encoding.hpp
# Opt level: O0

size_t __thiscall Centaurus::Encoder::wcstombs(Encoder *this,char *__s,wchar_t *__pwcs,size_t __n)

{
  __codecvt_abstract_base<wchar_t,_char,___mbstate_t> *this_00;
  mbstate_t mVar1;
  int iVar2;
  long lVar3;
  intern_type *__from;
  intern_type *__from_end;
  extern_type *__to;
  extern_type *__to_end;
  extern_type *local_50;
  char *to_next;
  wchar_t *from_next;
  allocator local_2a;
  undefined1 local_29;
  state_type local_28;
  mbstate_t mb;
  wstring *internal_local;
  Encoder *this_local;
  string *external;
  
  local_28.__count = 0;
  local_28.__value = (anon_union_4_2_91654ee9_for___value)0x0;
  local_29 = 0;
  mb = (mbstate_t)__pwcs;
  lVar3 = std::__cxx11::wstring::size();
  iVar2 = std::__codecvt_abstract_base<wchar_t,_char,___mbstate_t>::max_length
                    (*(__codecvt_abstract_base<wchar_t,_char,___mbstate_t> **)__s);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,lVar3 * iVar2,'\0',&local_2a);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a);
  this_00 = *(__codecvt_abstract_base<wchar_t,_char,___mbstate_t> **)__s;
  __from = (intern_type *)std::__cxx11::wstring::operator[]((ulong)mb);
  mVar1 = mb;
  std::__cxx11::wstring::size();
  __from_end = (intern_type *)std::__cxx11::wstring::operator[]((ulong)mVar1);
  __to = (extern_type *)std::__cxx11::string::operator[]((ulong)this);
  std::__cxx11::string::size();
  __to_end = (extern_type *)std::__cxx11::string::operator[]((ulong)this);
  std::__codecvt_abstract_base<wchar_t,_char,___mbstate_t>::out
            (this_00,&local_28,__from,__from_end,(intern_type **)&to_next,__to,__to_end,&local_50);
  std::__cxx11::string::operator[]((ulong)this);
  std::__cxx11::string::resize((ulong)this);
  return (size_t)this;
}

Assistant:

std::string wcstombs(const std::wstring& internal)
    {
        std::mbstate_t mb{};
        std::string external(internal.size() * m_forward_cvt.max_length(), '\0');

        const wchar_t *from_next;
        char *to_next;

        m_forward_cvt.out(mb, &internal[0], &internal[internal.size()], from_next, &external[0], &external[external.size()], to_next);

        external.resize(to_next - &external[0]);

        return external;
    }